

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t set_timefilter_date_w(archive_match *a,wchar_t timetype,wchar_t *datestr)

{
  int *piVar1;
  time_t mtime_sec;
  wchar_t *in_RDX;
  wchar_t in_ESI;
  archive_match *in_RDI;
  time_t t;
  archive_string as;
  char *in_stack_00001100;
  time_t in_stack_00001108;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  wchar_t wVar2;
  
  if ((in_RDX == (wchar_t *)0x0) || (*in_RDX == L'\0')) {
    archive_set_error(&in_RDI->archive,0x16,"date is empty");
    wVar2 = L'\xffffffe7';
  }
  else {
    wcslen(in_RDX);
    wVar2 = archive_string_append_from_wcs
                      ((archive_string *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (wchar_t *)in_RDI,CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
    if (wVar2 < L'\0') {
      archive_string_free((archive_string *)0x231199);
      piVar1 = __errno_location();
      if (*piVar1 == 0xc) {
        wVar2 = error_nomem((archive_match *)0x2311ad);
      }
      else {
        archive_set_error(&in_RDI->archive,-1,"Failed to convert WCS to MBS");
        wVar2 = L'\xffffffe7';
      }
    }
    else {
      mtime_sec = __archive_get_date(in_stack_00001108,in_stack_00001100);
      archive_string_free((archive_string *)0x2311fd);
      if (mtime_sec == -1) {
        archive_set_error(&in_RDI->archive,0x16,"invalid date string");
        wVar2 = L'\xffffffe7';
      }
      else {
        wVar2 = set_timefilter(in_RDI,in_ESI,mtime_sec,0,mtime_sec,0);
      }
    }
  }
  return wVar2;
}

Assistant:

static int
set_timefilter_date_w(struct archive_match *a, int timetype,
    const wchar_t *datestr)
{
	struct archive_string as;
	time_t t;

	if (datestr == NULL || *datestr == L'\0') {
		archive_set_error(&(a->archive), EINVAL, "date is empty");
		return (ARCHIVE_FAILED);
	}

	archive_string_init(&as);
	if (archive_string_append_from_wcs(&as, datestr, wcslen(datestr)) < 0) {
		archive_string_free(&as);
		if (errno == ENOMEM)
			return (error_nomem(a));
		archive_set_error(&(a->archive), -1,
		    "Failed to convert WCS to MBS");
		return (ARCHIVE_FAILED);
	}
	t = get_date(a->now, as.s);
	archive_string_free(&as);
	if (t == (time_t)-1) {
		archive_set_error(&(a->archive), EINVAL, "invalid date string");
		return (ARCHIVE_FAILED);
	}
	return set_timefilter(a, timetype, t, 0, t, 0);
}